

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::CompileRE2(int iters,string *regexp)

{
  int iVar1;
  RE2 re;
  RE2 local_290;
  LogMessage local_1b0;
  
  if (0 < iters) {
    do {
      RE2::RE2(&local_290,regexp);
      iVar1 = std::__cxx11::string::compare((char *)local_290.error_);
      if (iVar1 != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x2d7,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"Check failed: (re.error()) == (\"\")",0x22);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      RE2::~RE2(&local_290);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

void CompileRE2(int iters, const string& regexp) {
  for (int i = 0; i < iters; i++) {
    RE2 re(regexp);
    CHECK_EQ(re.error(), "");
  }
}